

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastEr1P2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  anon_class_40_5_0fd15717 add;
  anon_class_24_3_a3086cf8 size_callback;
  uint *puVar1;
  RepeatedField<int> *pRVar2;
  char *pcVar3;
  undefined7 uStack_3f;
  undefined6 uStack_26;
  
  if (data.field_0._0_2_ != 0) {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar1 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar1 & 3) != 0) {
      AlignFail(puVar1);
    }
    *puVar1 = *puVar1 | (uint)hasbits;
  }
  pRVar2 = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)pRVar2 & 7) == 0) {
    add._1_7_ = uStack_3f;
    add.max = data.field_0._3_1_;
    add._26_6_ = uStack_26;
    add.saved_tag = *(undefined2 *)ptr;
    add.msg = msg;
    add.table = table;
    add.field = pRVar2;
    size_callback.ctx = ctx;
    size_callback.field = pRVar2;
    size_callback.ptr = ptr + 2;
    pcVar3 = EpsCopyInputStream::
             ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_short,(unsigned_char)1>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_,google::protobuf::internal::TcParser::PackedEnumSmallRange<unsigned_short,(unsigned_char)1>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_2_>
                       (&ctx->super_EpsCopyInputStream,ptr + 2,add,size_callback);
    return pcVar3;
  }
  AlignFail(pRVar2);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr1P2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedEnumSmallRange<uint16_t, 1>(
      PROTOBUF_TC_PARAM_PASS);
}